

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onepass.cc
# Opt level: O1

bool __thiscall duckdb_re2::Prog::IsOnePass(Prog *this)

{
  int iVar1;
  byte bVar2;
  Inst *pIVar3;
  uchar *puVar4;
  undefined1 auVar5 [16];
  anon_struct_4_3_47ed7b4f_for_byte_range aVar6;
  bool bVar7;
  bool bVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  InstCond *pIVar15;
  int *__s;
  uchar *puVar16;
  byte bVar17;
  int iVar18;
  anon_struct_4_3_47ed7b4f_for_byte_range aVar19;
  _Tuple_impl<1UL,_duckdb_re2::PODArray<unsigned_char>::Deleter> _Var20;
  size_type __n;
  long lVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  _Head_base<0UL,_int_*,_false> _Var25;
  char cVar26;
  int iVar27;
  int iVar28;
  ulong uVar29;
  uint *puVar30;
  bool bVar31;
  vector<unsigned_char,_std::allocator<unsigned_char>_> nodes;
  Instq workq;
  Instq tovisit;
  uint local_278;
  int local_264;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_238;
  long local_220;
  long local_218;
  int *local_210;
  ulong local_208;
  SparseSetT<void> local_200;
  SparseSetT<void> local_1d8;
  new_allocator<duckdb_re2::InstCond> local_1b0 [8];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  if (this->did_onepass_ == true) {
    bVar31 = (this->onepass_nodes_).ptr_._M_t.
             super___uniq_ptr_impl<unsigned_char,_duckdb_re2::PODArray<unsigned_char>::Deleter>._M_t
             .super__Tuple_impl<0UL,_unsigned_char_*,_duckdb_re2::PODArray<unsigned_char>::Deleter>.
             super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl != (uchar *)0x0;
  }
  else {
    this->did_onepass_ = true;
    if ((this->start_ != 0) && ((long)this->inst_count_[2] < 0xfde6)) {
      local_220 = (long)this->inst_count_[2] + 2;
      lVar21 = this->dfa_mem_;
      lVar14 = lVar21 + 3;
      if (-1 < lVar21) {
        lVar14 = lVar21;
      }
      iVar1 = this->bytemap_range_ * 4 + 4;
      __n = (size_type)iVar1;
      auVar5._8_8_ = lVar14 >> 0x3f;
      auVar5._0_8_ = lVar14 >> 2;
      if (local_220 <= SUB168(auVar5 / SEXT816((long)__n),0)) {
        pIVar15 = __gnu_cxx::new_allocator<duckdb_re2::InstCond>::allocate
                            (local_1b0,
                             (long)(this->inst_count_[3] + this->inst_count_[4] +
                                    this->inst_count_[6] + 1),(void *)0x0);
        iVar27 = this->size_;
        __s = __gnu_cxx::new_allocator<int>::allocate
                        ((new_allocator<int> *)local_1b0,(long)iVar27,(void *)0x0);
        switchD_01306cb1::default(__s,0xff,(long)iVar27 * 4);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (uchar *)0x0;
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        SparseSetT<void>::SparseSetT(&local_1d8,iVar27);
        SparseSetT<void>::SparseSetT(&local_200,iVar27);
        AddQ(&local_1d8,this->start_);
        __s[this->start_] = 0;
        local_1b0[0] = (new_allocator<duckdb_re2::InstCond>)0x0;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_fill_insert
                  (&local_238,
                   (iterator)
                   local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish,__n,(value_type_conflict4 *)local_1b0);
        if (local_1d8.size_ == 0) {
          bVar31 = true;
          iVar27 = 1;
        }
        else {
          iVar27 = 1;
          _Var25._M_head_impl =
               local_1d8.dense_.ptr_._M_t.
               super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
               super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
               super__Head_base<0UL,_int_*,_false>._M_head_impl;
          do {
            iVar28 = *_Var25._M_head_impl;
            local_218 = (long)__s[iVar28] * __n;
            puVar30 = (uint *)(local_238.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start + local_218);
            if (0 < this->bytemap_range_) {
              lVar21 = 0;
              do {
                puVar30[lVar21 + 1] = 0x30;
                lVar21 = lVar21 + 1;
              } while (lVar21 < this->bytemap_range_);
            }
            *puVar30 = 0x30;
            local_200.size_ = 0;
            pIVar15->id = iVar28;
            bVar31 = false;
            pIVar15->cond = 0;
            local_264 = 1;
            local_210 = _Var25._M_head_impl;
            do {
              uVar29 = (ulong)(uint)pIVar15[(long)local_264 + -1].id;
              local_278 = pIVar15[(long)local_264 + -1].cond;
              local_264 = local_264 + -1;
              do {
                iVar28 = (int)uVar29;
                pIVar3 = (this->inst_).ptr_._M_t.
                         super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                         ._M_t.
                         super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                         .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>._M_head_impl;
                uVar9 = pIVar3[iVar28].out_opcode_;
                cVar26 = '\0';
                bVar8 = bVar31;
                switch(uVar9 & 7) {
                case 0:
                  local_1b0[0] = (new_allocator<duckdb_re2::InstCond>)0x0;
                  std::__cxx11::ostringstream::ostringstream(local_1a8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"unhandled opcode: ",0x12);
                  std::ostream::operator<<(local_1a8,pIVar3[iVar28].out_opcode_ & 7);
                  std::__cxx11::ostringstream::~ostringstream(local_1a8);
                  std::ios_base::~ios_base(local_138);
                  cVar26 = '\0';
                  break;
                case 1:
                  bVar8 = AddQ(&local_200,iVar28 + 1);
LAB_01860306:
                  uVar29 = uVar29 & 0xffffffff;
                  if (bVar8 != false) {
                    uVar29 = (ulong)(iVar28 + 1);
                  }
                  cVar26 = (bVar8 ^ 1U) * '\x02' + '\n';
                  bVar8 = bVar31;
                  break;
                case 2:
                  iVar10 = __s[uVar9 >> 4];
                  iVar18 = iVar27;
                  if (__s[uVar9 >> 4] == -1) {
                    cVar26 = '\f';
                    if (iVar27 < (int)local_220) {
                      AddQ(&local_1d8,uVar9 >> 4);
                      __s[pIVar3[iVar28].out_opcode_ >> 4] = iVar27;
                      local_1b0[0] = (new_allocator<duckdb_re2::InstCond>)0x0;
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_fill_insert
                                (&local_238,
                                 (iterator)
                                 local_238.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish,__n,
                                 (value_type_conflict4 *)local_1b0);
                      iVar18 = iVar27 + 1;
                      puVar30 = (uint *)(local_238.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start + local_218);
                      iVar10 = iVar27;
                      goto LAB_018603bb;
                    }
                  }
                  else {
LAB_018603bb:
                    bVar17 = pIVar3[iVar28].field_1.byte_range.lo_;
                    uVar9 = (uint)bVar17;
                    if (bVar17 <= pIVar3[iVar28].field_1.byte_range.hi_) {
                      uVar22 = iVar10 << 0x10 | local_278;
                      uVar11 = uVar22 | 0x40;
                      if (!bVar31) {
                        uVar11 = uVar22;
                      }
                      do {
                        bVar17 = this->bytemap_[(int)uVar9];
                        uVar22 = 0xff;
                        if (0xff < (int)uVar9) {
                          uVar22 = uVar9;
                        }
                        uVar23 = uVar9 - 1;
                        lVar21 = (long)(int)uVar9;
                        do {
                          uVar24 = uVar22;
                          if (0xfe < lVar21) break;
                          uVar23 = uVar23 + 1;
                          lVar14 = lVar21 + 1;
                          lVar21 = lVar21 + 1;
                          uVar24 = uVar23;
                        } while (this->bytemap_[lVar14] == bVar17);
                        if ((~puVar30[(ulong)bVar17 + 1] & 0x30) == 0) {
                          puVar30[(ulong)bVar17 + 1] = uVar11;
LAB_0186043d:
                          cVar26 = '\0';
                          bVar7 = true;
                        }
                        else {
                          if (puVar30[(ulong)bVar17 + 1] == uVar11) goto LAB_0186043d;
                          cVar26 = '\f';
                          bVar7 = false;
                        }
                        if (!bVar7) goto LAB_01860462;
                        uVar9 = uVar24 + 1;
                      } while ((int)uVar24 < (int)(uint)pIVar3[iVar28].field_1.byte_range.hi_);
                    }
                    cVar26 = '\r';
LAB_01860462:
                    if (cVar26 == '\r') {
                      if ((pIVar3[iVar28].field_1.out1_ & 0x10000) != 0) {
                        aVar19.lo_ = 'a';
                        aVar19.hi_ = '\0';
                        aVar19.hint_foldcase_ = 0;
                        aVar6 = pIVar3[iVar28].field_1.byte_range;
                        if (pIVar3[iVar28].field_1.byte_range.lo_ < 0x62) {
                          aVar6 = aVar19;
                        }
                        bVar17 = pIVar3[iVar28].field_1.byte_range.hi_;
                        if (0x79 < bVar17) {
                          bVar17 = 0x7a;
                        }
                        if (aVar6.lo_ <= bVar17) {
                          iVar27 = ((uint)aVar6 & 0xff) - 0x20;
                          uVar11 = iVar10 << 0x10 | local_278;
                          uVar9 = uVar11 | 0x40;
                          if (!bVar31) {
                            uVar9 = uVar11;
                          }
                          do {
                            bVar2 = this->bytemap_[iVar27];
                            iVar10 = 0xff;
                            if (0xff < iVar27) {
                              iVar10 = iVar27;
                            }
                            iVar12 = iVar27 + -1;
                            lVar21 = (long)iVar27;
                            do {
                              iVar13 = iVar10;
                              if (0xfe < lVar21) break;
                              iVar12 = iVar12 + 1;
                              lVar14 = lVar21 + 1;
                              lVar21 = lVar21 + 1;
                              iVar13 = iVar12;
                            } while (this->bytemap_[lVar14] == bVar2);
                            if ((~puVar30[(ulong)bVar2 + 1] & 0x30) == 0) {
                              puVar30[(ulong)bVar2 + 1] = uVar9;
LAB_0186051b:
                              cVar26 = '\0';
                              bVar31 = true;
                            }
                            else {
                              if (puVar30[(ulong)bVar2 + 1] == uVar9) goto LAB_0186051b;
                              cVar26 = '\f';
                              bVar31 = false;
                            }
                            if (!bVar31) goto LAB_0186053a;
                            iVar27 = iVar13 + 1;
                          } while (iVar13 < (int)(bVar17 - 0x20));
                        }
                        cVar26 = '\x12';
LAB_0186053a:
                        if (cVar26 != '\x12') goto LAB_01860581;
                      }
                      cVar26 = '\v';
                      if ((pIVar3[iVar28].out_opcode_ & 8) == 0) {
                        bVar31 = AddQ(&local_200,iVar28 + 1U);
                        uVar29 = uVar29 & 0xffffffff;
                        if (bVar31) {
                          uVar29 = (ulong)(iVar28 + 1U);
                        }
                        cVar26 = !bVar31 * '\x02' + '\n';
                      }
                    }
                  }
LAB_01860581:
                  iVar27 = iVar18;
                  if (cVar26 == '\v') {
                    cVar26 = '\0';
                  }
                  break;
                default:
                  if ((uVar9 & 8) == 0) {
                    bVar31 = AddQ(&local_200,iVar28 + 1);
                    cVar26 = '\f';
                    if (!bVar31) break;
                    lVar21 = (long)local_264;
                    pIVar15[lVar21].id = iVar28 + 1;
                    local_264 = local_264 + 1;
                    pIVar15[lVar21].cond = local_278;
                  }
                  uVar9 = pIVar3[iVar28].out_opcode_ & 7;
                  if ((uVar9 == 3) && ((int)pIVar3[iVar28].field_1.byte_range < 10)) {
                    local_278 = local_278 | 0x20 << (pIVar3[iVar28].field_1.byte_range.lo_ & 0x1f);
                  }
                  if (uVar9 == 4) {
                    local_278 = local_278 | pIVar3[iVar28].field_1.out1_;
                  }
                  local_208 = uVar29;
                  bVar31 = AddQ(&local_200,pIVar3[iVar28].out_opcode_ >> 4);
                  uVar29 = local_208;
                  cVar26 = '\f';
                  if (bVar31) {
                    uVar29 = (ulong)(pIVar3[iVar28].out_opcode_ >> 4);
                    cVar26 = '\n';
                  }
                  break;
                case 5:
                  if (bVar31) {
                    cVar26 = '\f';
                  }
                  else {
                    *puVar30 = local_278;
                    bVar31 = true;
                    bVar8 = true;
                    if ((uVar9 & 8) == 0) {
                      bVar8 = AddQ(&local_200,iVar28 + 1);
                      goto LAB_01860306;
                    }
                  }
                  break;
                case 7:
                  break;
                }
                bVar31 = bVar8;
              } while (cVar26 == '\n');
              if (cVar26 != '\0') goto LAB_01860644;
            } while (0 < local_264);
            cVar26 = '\0';
LAB_01860644:
            if (cVar26 != '\0') goto LAB_01860678;
            _Var25._M_head_impl = local_210 + 1;
          } while (_Var25._M_head_impl !=
                   local_1d8.dense_.ptr_._M_t.
                   super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
                   super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
                   super__Head_base<0UL,_int_*,_false>._M_head_impl + local_1d8.size_);
          cVar26 = '\x02';
LAB_01860678:
          bVar31 = cVar26 == '\x02';
        }
        if (bVar31 != false) {
          _Var20.super__Head_base<1UL,_duckdb_re2::PODArray<unsigned_char>::Deleter,_false>.
          _M_head_impl.len_ =
               (_Head_base<1UL,_duckdb_re2::PODArray<unsigned_char>::Deleter,_false>)
               (iVar27 * iVar1);
          this->dfa_mem_ =
               this->dfa_mem_ -
               (long)(int)_Var20.
                          super__Head_base<1UL,_duckdb_re2::PODArray<unsigned_char>::Deleter,_false>
                          ._M_head_impl.len_;
          if ((int)_Var20.super__Head_base<1UL,_duckdb_re2::PODArray<unsigned_char>::Deleter,_false>
                   ._M_head_impl.len_ < 0) {
            std::__throw_bad_alloc();
          }
          puVar16 = (uchar *)operator_new((ulong)(uint)_Var20.
                                                  super__Head_base<1UL,_duckdb_re2::PODArray<unsigned_char>::Deleter,_false>
                                                  ._M_head_impl.len_);
          puVar4 = (this->onepass_nodes_).ptr_._M_t.
                   super___uniq_ptr_impl<unsigned_char,_duckdb_re2::PODArray<unsigned_char>::Deleter>
                   ._M_t.
                   super__Tuple_impl<0UL,_unsigned_char_*,_duckdb_re2::PODArray<unsigned_char>::Deleter>
                   .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
          (this->onepass_nodes_).ptr_._M_t.
          super___uniq_ptr_impl<unsigned_char,_duckdb_re2::PODArray<unsigned_char>::Deleter>._M_t.
          super__Tuple_impl<0UL,_unsigned_char_*,_duckdb_re2::PODArray<unsigned_char>::Deleter>.
          super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = puVar16;
          if (puVar4 != (uchar *)0x0) {
            operator_delete(puVar4);
          }
          (this->onepass_nodes_).ptr_._M_t.
          super___uniq_ptr_impl<unsigned_char,_duckdb_re2::PODArray<unsigned_char>::Deleter>._M_t.
          super__Tuple_impl<0UL,_unsigned_char_*,_duckdb_re2::PODArray<unsigned_char>::Deleter>.
          super__Tuple_impl<1UL,_duckdb_re2::PODArray<unsigned_char>::Deleter>.
          super__Head_base<1UL,_duckdb_re2::PODArray<unsigned_char>::Deleter,_false> =
               _Var20.super__Head_base<1UL,_duckdb_re2::PODArray<unsigned_char>::Deleter,_false>.
               _M_head_impl.len_;
          memmove((this->onepass_nodes_).ptr_._M_t.
                  super___uniq_ptr_impl<unsigned_char,_duckdb_re2::PODArray<unsigned_char>::Deleter>
                  ._M_t.
                  super__Tuple_impl<0UL,_unsigned_char_*,_duckdb_re2::PODArray<unsigned_char>::Deleter>
                  .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,
                  local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start,
                  (long)(int)_Var20.
                             super__Head_base<1UL,_duckdb_re2::PODArray<unsigned_char>::Deleter,_false>
                             ._M_head_impl.len_);
        }
        SparseSetT<void>::~SparseSetT(&local_200);
        SparseSetT<void>::~SparseSetT(&local_1d8);
        if (local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_238.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (__s != (int *)0x0) {
          operator_delete(__s);
        }
        if (pIVar15 == (InstCond *)0x0) {
          return bVar31;
        }
        operator_delete(pIVar15);
        return bVar31;
      }
    }
    bVar31 = false;
  }
  return bVar31;
}

Assistant:

bool Prog::IsOnePass() {
  if (did_onepass_)
    return onepass_nodes_.data() != NULL;
  did_onepass_ = true;

  if (start() == 0)  // no match
    return false;

  // Steal memory for the one-pass NFA from the overall DFA budget.
  // Willing to use at most 1/4 of the DFA budget (heuristic).
  // Limit max node count to 65000 as a conservative estimate to
  // avoid overflowing 16-bit node index in encoding.
  int maxnodes = 2 + inst_count(kInstByteRange);
  int statesize = sizeof(uint32_t) + bytemap_range()*sizeof(uint32_t);
  if (maxnodes >= 65000 || dfa_mem_ / 4 / statesize < maxnodes)
    return false;

  // Flood the graph starting at the start state, and check
  // that in each reachable state, each possible byte leads
  // to a unique next state.
  int stacksize = inst_count(kInstCapture) +
                  inst_count(kInstEmptyWidth) +
                  inst_count(kInstNop) + 1;  // + 1 for start inst
  PODArray<InstCond> stack(stacksize);

  int size = this->size();
  PODArray<int> nodebyid(size);  // indexed by ip
  memset(nodebyid.data(), 0xFF, size*sizeof nodebyid[0]);

  // Originally, nodes was a uint8_t[maxnodes*statesize], but that was
  // unnecessarily optimistic: why allocate a large amount of memory
  // upfront for a large program when it is unlikely to be one-pass?
  std::vector<uint8_t> nodes;

  Instq tovisit(size), workq(size);
  AddQ(&tovisit, start());
  nodebyid[start()] = 0;
  int nalloc = 1;
  nodes.insert(nodes.end(), statesize, 0);
  for (Instq::iterator it = tovisit.begin(); it != tovisit.end(); ++it) {
    int id = *it;
    int nodeindex = nodebyid[id];
    OneState* node = IndexToNode(nodes.data(), statesize, nodeindex);

    // Flood graph using manual stack, filling in actions as found.
    // Default is none.
    for (int b = 0; b < bytemap_range_; b++)
      node->action[b] = kImpossible;
    node->matchcond = kImpossible;

    workq.clear();
    bool matched = false;
    int nstack = 0;
    stack[nstack].id = id;
    stack[nstack++].cond = 0;
    while (nstack > 0) {
      int id = stack[--nstack].id;
      uint32_t cond = stack[nstack].cond;

    Loop:
      Prog::Inst* ip = inst(id);
      switch (ip->opcode()) {
        default:
          LOG(DFATAL) << "unhandled opcode: " << ip->opcode();
          break;

        case kInstAltMatch:
          // TODO(rsc): Ignoring kInstAltMatch optimization.
          // Should implement it in this engine, but it's subtle.
          DCHECK(!ip->last());
          // If already on work queue, (1) is violated: bail out.
          if (!AddQ(&workq, id+1))
            goto fail;
          id = id+1;
          goto Loop;

        case kInstByteRange: {
          int nextindex = nodebyid[ip->out()];
          if (nextindex == -1) {
            if (nalloc >= maxnodes) {
              goto fail;
            }
            nextindex = nalloc;
            AddQ(&tovisit, ip->out());
            nodebyid[ip->out()] = nalloc;
            nalloc++;
            nodes.insert(nodes.end(), statesize, 0);
            // Update node because it might have been invalidated.
            node = IndexToNode(nodes.data(), statesize, nodeindex);
          }
          for (int c = ip->lo(); c <= ip->hi(); c++) {
            int b = bytemap_[c];
            // Skip any bytes immediately after c that are also in b.
            while (c < 256-1 && bytemap_[c+1] == b)
              c++;
            uint32_t act = node->action[b];
            uint32_t newact = (nextindex << kIndexShift) | cond;
            if (matched)
              newact |= kMatchWins;
            if ((act & kImpossible) == kImpossible) {
              node->action[b] = newact;
            } else if (act != newact) {
              goto fail;
            }
          }
          if (ip->foldcase()) {
            Rune lo = std::max<Rune>(ip->lo(), 'a') + 'A' - 'a';
            Rune hi = std::min<Rune>(ip->hi(), 'z') + 'A' - 'a';
            for (int c = lo; c <= hi; c++) {
              int b = bytemap_[c];
              // Skip any bytes immediately after c that are also in b.
              while (c < 256-1 && bytemap_[c+1] == b)
                c++;
              uint32_t act = node->action[b];
              uint32_t newact = (nextindex << kIndexShift) | cond;
              if (matched)
                newact |= kMatchWins;
              if ((act & kImpossible) == kImpossible) {
                node->action[b] = newact;
              } else if (act != newact) {
                goto fail;
              }
            }
          }

          if (ip->last())
            break;
          // If already on work queue, (1) is violated: bail out.
          if (!AddQ(&workq, id+1))
            goto fail;
          id = id+1;
          goto Loop;
        }

        case kInstCapture:
        case kInstEmptyWidth:
        case kInstNop:
          if (!ip->last()) {
            // If already on work queue, (1) is violated: bail out.
            if (!AddQ(&workq, id+1))
              goto fail;
            stack[nstack].id = id+1;
            stack[nstack++].cond = cond;
          }

          if (ip->opcode() == kInstCapture && ip->cap() < kMaxCap)
            cond |= (1 << kCapShift) << ip->cap();
          if (ip->opcode() == kInstEmptyWidth)
            cond |= ip->empty();

          // kInstCapture and kInstNop always proceed to ip->out().
          // kInstEmptyWidth only sometimes proceeds to ip->out(),
          // but as a conservative approximation we assume it always does.
          // We could be a little more precise by looking at what c
          // is, but that seems like overkill.

          // If already on work queue, (1) is violated: bail out.
          if (!AddQ(&workq, ip->out())) {
            goto fail;
          }
          id = ip->out();
          goto Loop;

        case kInstMatch:
          if (matched) {
            // (3) is violated
            goto fail;
          }
          matched = true;
          node->matchcond = cond;

          if (ip->last())
            break;
          // If already on work queue, (1) is violated: bail out.
          if (!AddQ(&workq, id+1))
            goto fail;
          id = id+1;
          goto Loop;

        case kInstFail:
          break;
      }
    }
  }

  dfa_mem_ -= nalloc*statesize;
  onepass_nodes_ = PODArray<uint8_t>(nalloc*statesize);
  memmove(onepass_nodes_.data(), nodes.data(), nalloc*statesize);
  return true;

fail:
  return false;
}